

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

bool __thiscall
TPZFMatrix<long_double>::Compare(TPZFMatrix<long_double> *this,TPZSavable *copy,bool override)

{
  longdouble lVar1;
  longdouble lVar2;
  bool bVar3;
  long lVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  stringstream sout;
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  longdouble local_1c4;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  if (copy != (TPZSavable *)0x0) {
    lVar4 = __dynamic_cast(copy,&TPZSavable::typeinfo,&typeinfo,0);
    if (lVar4 == 0) {
      return false;
    }
    bVar3 = TPZMatrix<long_double>::Compare(&this->super_TPZMatrix<long_double>,copy,false);
    lVar6 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol *
            (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
    local_1c4 = (longdouble)0;
    if (0 < lVar6) {
      local_1c4 = (longdouble)0;
      lVar7 = 0;
      do {
        lVar1 = *(longdouble *)((long)this->fElem + lVar7);
        lVar2 = *(longdouble *)(*(long *)(lVar4 + 0x20) + lVar7);
        bVar3 = (bool)(bVar3 & lVar1 == lVar2);
        local_1c4 = ABS(lVar1 - lVar2) + local_1c4;
        lVar7 = lVar7 + 0x10;
        lVar6 = lVar6 + -1;
      } while (lVar6 != 0);
    }
    if (bVar3 != false) {
      return true;
    }
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "virtual bool TPZFMatrix<long double>::Compare(TPZSavable *, bool) const [TVar = long double]"
               ,0x5c);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," did not compare ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," number different terms ",0x18);
    poVar5 = std::ostream::_M_insert<long>((long)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," number terms ",0xe);
    std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8," difference in norm L1 ",0x17);
    std::ostream::_M_insert<long_double>(local_1c4);
    std::__cxx11::stringbuf::str();
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_1e8,local_1e0);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1b8);
    std::ios_base::~ios_base(local_138);
    if (override) {
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.cpp"
                 ,0x903);
    }
  }
  return false;
}

Assistant:

bool TPZFMatrix<TVar>::Compare(TPZSavable *copy, bool override) const
{
    TPZFMatrix<TVar> *fmat = dynamic_cast<TPZFMatrix<TVar> *> (copy);
    if(!fmat) return false;
    
    bool matresult = TPZMatrix<TVar>::Compare(copy,false);
    int64_t nel = this->fRow*this->fCol;
    TVar diff=0.;
    int64_t numdif = 0;
    int64_t iel;
    for(iel=0; iel<nel; iel++)
    {
        if(fElem[iel] != fmat->fElem[iel])
        {
            matresult = false;
            numdif++;
        }
        TVar exp = fElem[iel]-fmat->fElem[iel];
        diff += fabs(exp);
    }
    if(!matresult)
    {
        std::stringstream sout;
        sout << __PRETTY_FUNCTION__ << " did not compare ";
        sout << " number different terms " << numdif << " number terms " << this->fRow*this->fCol;
        sout << " difference in norm L1 " << diff;
        LOGPZ_ERROR(loggerCheck,sout.str())
    }
    if(!matresult && override)
    {
        DebugStop();
    }
    return matresult;
}